

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  Map_Man_t *p;
  char **ppNames;
  Abc_Time_t *pAVar5;
  Map_Time_t *pMVar6;
  Map_Node_t *pMVar7;
  Abc_Obj_t *pAVar8;
  Map_Node_t **ppMVar9;
  Vec_Ptr_t *p_00;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  int iVar13;
  char *__assertion;
  ulong uVar14;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                  ,0xe3,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p != (Map_Man_t *)0x0) {
    Map_ManSetAreaRecovery(p,fRecovery);
    ppNames = Abc_NtkCollectCioNames(pNtk,1);
    Map_ManSetOutputNames(p,ppNames);
    Map_ManSetDelayTarget(p,(float)DelayTarget);
    pAVar5 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar6 = Abc_NtkMapCopyCiArrival(pNtk,pAVar5);
    Map_ManSetInputArrivals(p,pMVar6);
    pAVar5 = Abc_NtkGetCoRequiredTimes(pNtk);
    pMVar6 = Abc_NtkMapCopyCoRequired(pNtk,pAVar5);
    Map_ManSetOutputRequireds(p,pMVar6);
    Abc_NtkCleanCopy(pNtk);
    pMVar7 = Map_ManReadConst1(p);
    pAVar8 = Abc_AigConst1(pNtk);
    (pAVar8->field_6).pCopy = (Abc_Obj_t *)pMVar7;
    for (uVar14 = 0;
        ((long)uVar14 < (long)pNtk->vCis->nSize &&
        (pAVar8 = Abc_NtkCi(pNtk,(int)uVar14), uVar14 != (uint)(pNtk->vCis->nSize - pNtk->nBarBufs))
        ); uVar14 = uVar14 + 1) {
      ppMVar9 = Map_ManReadInputs(p);
      pMVar7 = ppMVar9[uVar14];
      (pAVar8->field_6).pCopy = (Abc_Obj_t *)pMVar7;
      if (pSwitching != (float *)0x0) {
        Map_NodeSetSwitching(pMVar7,pSwitching[pAVar8->Id]);
      }
    }
    p_00 = Abc_AigDfsMap(pNtk);
    for (iVar13 = 0; iVar13 < p_00->nSize; iVar13 = iVar13 + 1) {
      plVar10 = (long *)Vec_PtrEntry(p_00,iVar13);
      uVar1 = *(uint *)((long)plVar10 + 0x14);
      if ((uVar1 & 0xf) == 7) {
        lVar3 = *(long *)(*(long *)(*plVar10 + 0x20) + 8);
        pMVar7 = Map_NodeAnd(p,(Map_Node_t *)
                               ((ulong)(uVar1 >> 10 & 1) ^
                               *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar10[4] * 8) + 0x40)),
                             (Map_Node_t *)
                             ((ulong)(uVar1 >> 0xb & 1) ^
                             *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar10[4])[1] * 8) + 0x40))
                            );
        if (plVar10[8] != 0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                        ,0x10c,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar10[8] = (long)pMVar7;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar7,pSwitching[(int)plVar10[2]]);
        }
        if (((ulong)plVar10 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0024aa73:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (*(int *)*plVar10 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0024aa73;
        }
        if (((long *)plVar10[7] != (long *)0x0) &&
           (plVar2 = (long *)plVar10[7], plVar12 = plVar10, 0 < *(int *)((long)plVar10 + 0x2c))) {
          while (plVar11 = plVar2, plVar11 != (long *)0x0) {
            Map_NodeSetNextE((Map_Node_t *)plVar12[8],(Map_Node_t *)plVar11[8]);
            Map_NodeSetRepr((Map_Node_t *)plVar11[8],(Map_Node_t *)plVar10[8]);
            plVar12 = plVar11;
            plVar2 = (long *)plVar11[7];
          }
        }
      }
      else {
        if ((uVar1 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                        ,0x107,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) + (long)*(int *)plVar10[4] * 8
                           );
        pMVar7 = Map_NodeBuf(p,(Map_Node_t *)
                               ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                               *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                   (long)*(int *)plVar2[4] * 8) + 0x40)));
        *(Map_Node_t **)
         (*(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) + (long)*(int *)plVar10[6] * 8) + 0x40
         ) = pMVar7;
      }
    }
    iVar13 = Map_ManReadBufNum(p);
    if (iVar13 != pNtk->nBarBufs) {
      __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                    ,0x119,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
    }
    Vec_PtrFree(p_00);
    for (uVar14 = 0;
        ((long)uVar14 < (long)pNtk->vCos->nSize &&
        (pAVar8 = Abc_NtkCo(pNtk,(int)uVar14), uVar14 != (uint)(pNtk->vCos->nSize - pNtk->nBarBufs))
        ); uVar14 = uVar14 + 1) {
      uVar1 = *(uint *)&pAVar8->field_0x14;
      uVar4 = *(ulong *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x40);
      ppMVar9 = Map_ManReadOutputs(p);
      ppMVar9[uVar14] = (Map_Node_t *)(uVar1 >> 10 & 1 ^ uVar4);
    }
  }
  return p;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );
    Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}